

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O0

VP8StatusCode AllocateBuffer(WebPDecBuffer *buffer)

{
  int iVar1;
  WEBP_CSP_MODE mode_00;
  int iVar2;
  int iVar3;
  int iVar4;
  VP8StatusCode VVar5;
  size_t sVar6;
  uint8_t *puVar7;
  WebPDecBuffer *in_RDI;
  WebPRGBABuffer *buf_1;
  WebPYUVABuffer *buf;
  uint64_t size;
  int stride;
  uint64_t total_size;
  uint64_t a_size;
  uint64_t uv_size;
  int a_stride;
  int uv_stride;
  uint8_t *output;
  WEBP_CSP_MODE mode;
  int h;
  int w;
  size_t in_stack_ffffffffffffff90;
  uint64_t in_stack_ffffffffffffff98;
  size_t local_40;
  size_t local_38;
  int local_30;
  int local_2c;
  
  iVar4 = in_RDI->width;
  iVar1 = in_RDI->height;
  mode_00 = in_RDI->colorspace;
  if (((iVar4 < 1) || (iVar1 < 1)) || (iVar2 = IsValidColorspace(mode_00), iVar2 == 0)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if ((in_RDI->is_external_memory < 1) && (in_RDI->private_memory == (uint8_t *)0x0)) {
    local_2c = 0;
    local_30 = 0;
    local_38 = 0;
    local_40 = 0;
    if (0x7fffffff <
        (long)iVar4 * (ulong)"\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"[mode_00]) {
      return VP8_STATUS_INVALID_PARAM;
    }
    iVar2 = iVar4 * (uint)"\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"[mode_00];
    sVar6 = (long)iVar2 * (long)iVar1;
    iVar3 = WebPIsRGBMode(mode_00);
    if (iVar3 == 0) {
      local_2c = (iVar4 + 1) / 2;
      in_stack_ffffffffffffff90 = (size_t)local_2c;
      local_38 = in_stack_ffffffffffffff90 * (long)((iVar1 + 1) / 2);
      if (mode_00 == MODE_YUVA) {
        local_40 = (long)iVar4 * (long)iVar1;
        local_30 = iVar4;
      }
    }
    puVar7 = (uint8_t *)WebPSafeMalloc(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (puVar7 == (uint8_t *)0x0) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    in_RDI->private_memory = puVar7;
    iVar4 = WebPIsRGBMode(mode_00);
    if (iVar4 == 0) {
      (in_RDI->u).RGBA.rgba = puVar7;
      (in_RDI->u).YUVA.y_stride = iVar2;
      (in_RDI->u).YUVA.y_size = sVar6;
      (in_RDI->u).YUVA.u = puVar7 + sVar6;
      (in_RDI->u).YUVA.u_stride = local_2c;
      (in_RDI->u).YUVA.u_size = local_38;
      (in_RDI->u).YUVA.v = puVar7 + local_38 + sVar6;
      (in_RDI->u).YUVA.v_stride = local_2c;
      (in_RDI->u).YUVA.v_size = local_38;
      if (mode_00 == MODE_YUVA) {
        (in_RDI->u).YUVA.a = puVar7 + local_38 * 2 + sVar6;
      }
      (in_RDI->u).YUVA.a_size = local_40;
      (in_RDI->u).YUVA.a_stride = local_30;
    }
    else {
      (in_RDI->u).RGBA.rgba = puVar7;
      (in_RDI->u).RGBA.stride = iVar2;
      (in_RDI->u).RGBA.size = sVar6;
    }
  }
  VVar5 = CheckDecBuffer(in_RDI);
  return VVar5;
}

Assistant:

static VP8StatusCode AllocateBuffer(WebPDecBuffer* const buffer) {
  const int w = buffer->width;
  const int h = buffer->height;
  const WEBP_CSP_MODE mode = buffer->colorspace;

  if (w <= 0 || h <= 0 || !IsValidColorspace(mode)) {
    return VP8_STATUS_INVALID_PARAM;
  }

  if (buffer->is_external_memory <= 0 && buffer->private_memory == NULL) {
    uint8_t* output;
    int uv_stride = 0, a_stride = 0;
    uint64_t uv_size = 0, a_size = 0, total_size;
    // We need memory and it hasn't been allocated yet.
    // => initialize output buffer, now that dimensions are known.
    int stride;
    uint64_t size;

    if ((uint64_t)w * kModeBpp[mode] >= (1ull << 31)) {
      return VP8_STATUS_INVALID_PARAM;
    }
    stride = w * kModeBpp[mode];
    size = (uint64_t)stride * h;
    if (!WebPIsRGBMode(mode)) {
      uv_stride = (w + 1) / 2;
      uv_size = (uint64_t)uv_stride * ((h + 1) / 2);
      if (mode == MODE_YUVA) {
        a_stride = w;
        a_size = (uint64_t)a_stride * h;
      }
    }
    total_size = size + 2 * uv_size + a_size;

    output = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*output));
    if (output == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    buffer->private_memory = output;

    if (!WebPIsRGBMode(mode)) {   // YUVA initialization
      WebPYUVABuffer* const buf = &buffer->u.YUVA;
      buf->y = output;
      buf->y_stride = stride;
      buf->y_size = (size_t)size;
      buf->u = output + size;
      buf->u_stride = uv_stride;
      buf->u_size = (size_t)uv_size;
      buf->v = output + size + uv_size;
      buf->v_stride = uv_stride;
      buf->v_size = (size_t)uv_size;
      if (mode == MODE_YUVA) {
        buf->a = output + size + 2 * uv_size;
      }
      buf->a_size = (size_t)a_size;
      buf->a_stride = a_stride;
    } else {  // RGBA initialization
      WebPRGBABuffer* const buf = &buffer->u.RGBA;
      buf->rgba = output;
      buf->stride = stride;
      buf->size = (size_t)size;
    }
  }
  return CheckDecBuffer(buffer);
}